

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O3

rgba_t sfc::normalize_color(rgba_t color,Mode from_mode)

{
  rgba_t rVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 in_register_0000003c;
  undefined8 uVar5;
  
  uVar5 = CONCAT44(in_register_0000003c,color);
  if ((int)color < 0) {
    uVar2 = color >> 8;
    uVar3 = color >> 0x10;
    uVar4 = color >> 0x18;
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    uVar2 = 0;
    uVar5 = 0;
  }
  rVar1 = (*(code *)(&DAT_00160048 + *(int *)(&DAT_00160048 + (ulong)from_mode * 4)))
                    (uVar5,uVar4,uVar3,uVar2,
                     &DAT_00160048 + *(int *)(&DAT_00160048 + (ulong)from_mode * 4));
  return rVar1;
}

Assistant:

inline rgba_t normalize_color(const rgba_t color, Mode from_mode) {
  rgba_color c(color);
  switch (from_mode) {
  case Mode::snes:
  case Mode::snes_mode7:
  case Mode::gbc:
  case Mode::gba:
  case Mode::gba_affine:
    c.r = scale_up(c.r, 3);
    c.g = scale_up(c.g, 3);
    c.b = scale_up(c.b, 3);
    c.a = scale_up(c.a, 3);
    return c;
  case Mode::gb:
  case Mode::sms:
    c.r = scale_up(c.r, 6);
    c.g = scale_up(c.g, 6);
    c.b = scale_up(c.b, 6);
    c.a = scale_up(c.a, 6);
    return c;
  case Mode::wsc:
  case Mode::wsc_packed:
  case Mode::ngpc:
  case Mode::gg:
    c.r = scale_up(c.r, 4);
    c.g = scale_up(c.g, 4);
    c.b = scale_up(c.b, 4);
    c.a = scale_up(c.a, 4);
    return c;
  case Mode::md:
  case Mode::pce:
  case Mode::pce_sprite:
  case Mode::ws:
  case Mode::ngp:
    c.r = scale_up(c.r, 5);
    c.g = scale_up(c.g, 5);
    c.b = scale_up(c.b, 5);
    c.a = scale_up(c.a, 5);
    return c;
  case Mode::none:
    return 0;
  }
}